

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O3

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>>
               (__normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
                begin,__normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
                      end,
               __normal_iterator<std::array<unsigned_long,_3UL>_*,_std::vector<std::array<unsigned_long,_3UL>,_std::allocator<std::array<unsigned_long,_3UL>_>_>_>
               out,comm *comm)

{
  int iVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  pointer puVar9;
  ulong uVar10;
  size_t local_size;
  int result;
  custom_op<unsigned_long,_true> op;
  allocator_type local_91;
  pointer local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  custom_op<unsigned_long,_true> local_70;
  
  if (comm->m_size == 1) {
    if ((long)end._M_current - (long)begin._M_current != 0) {
      memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
      return;
    }
  }
  else {
    local_90 = (pointer)(((long)end._M_current - (long)begin._M_current >> 3) * -0x5555555555555555)
    ;
    custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
              ((custom_op<unsigned_long,true> *)&local_70);
    MPI_Allreduce(&local_90,&local_88,1,local_70.m_type_copy,local_70.m_op,comm->mpi_comm);
    puVar7 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    custom_op<unsigned_long,_true>::~custom_op(&local_70);
    if (puVar7 != (pointer)0x0) {
      local_70._vptr_custom_op._0_4_ = (uint)(local_90 == puVar7);
      MPI_Allreduce(&local_70,&local_88,1,&ompi_mpi_int,&ompi_mpi_op_lor,comm->mpi_comm);
      if ((int)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start == 0) {
        uVar2 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_90,comm);
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
                   (long)comm->m_size,(value_type_conflict1 *)&local_88,&local_91);
        uVar8 = (ulong)comm->m_size;
        uVar3 = (ulong)puVar7 / uVar8;
        uVar5 = (ulong)puVar7 % uVar8;
        uVar6 = (uVar3 + 1) * uVar5;
        if (uVar2 < uVar6) {
          iVar1 = (int)(uVar2 / (uVar3 + 1));
        }
        else {
          iVar1 = (int)((uVar2 - uVar6) / uVar3) + (int)uVar5;
        }
        if ((local_90 != (pointer)0x0) && (iVar1 < comm->m_size)) {
          uVar4 = (ulong)iVar1;
          puVar7 = local_90;
          uVar6 = uVar4;
          do {
            uVar6 = uVar6 + 1;
            uVar4 = uVar4 + 1;
            uVar10 = uVar6;
            if (uVar5 < uVar6) {
              uVar10 = uVar5;
            }
            puVar9 = (pointer)((uVar3 * uVar4 - uVar2) + uVar10);
            if (puVar7 < puVar9) {
              puVar9 = puVar7;
            }
            *(pointer *)
             (CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) + -8 +
             uVar6 * 8) = puVar9;
            puVar7 = (pointer)((long)puVar7 - (long)puVar9);
          } while ((puVar7 != (pointer)0x0) &&
                  (uVar2 = uVar2 + (long)puVar9, (long)uVar6 < (long)uVar8));
        }
        all2all<unsigned_long>
                  (&local_88,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,comm
                  );
        all2allv<std::array<unsigned_long,3ul>>
                  (begin._M_current,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,out._M_current
                   ,&local_88,comm);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) !=
            (void *)0x0) {
          operator_delete((void *)CONCAT44(local_70._vptr_custom_op._4_4_,
                                           (uint)local_70._vptr_custom_op));
        }
      }
      else {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>,__gnu_cxx::__normal_iterator<std::array<unsigned_long,3ul>*,std::vector<std::array<unsigned_long,3ul>,std::allocator<std::array<unsigned_long,3ul>>>>>
                  (begin,end,out,(size_t)puVar7,comm);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    std::size_t local_size = std::distance(begin, end);
    std::size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        std::size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        std::vector<size_t> send_counts(comm.size(), 0);
        partition::block_decomposition<std::size_t> part(total_size, comm.size(), comm.rank());
        int first_p = part.target_processor(prefix);
        std::size_t left_to_send = local_size;
        for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
            std::size_t nsend = std::min<std::size_t>(part.prefix_size(first_p) - prefix, left_to_send);
            send_counts[first_p] = nsend;
            left_to_send -= nsend;
            prefix += nsend;
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
    }
}